

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_case.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformCase(Transformer *this,PGCaseExpr *root)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  optional_ptr<duckdb::Transformer,_true> *poVar2;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  CaseExpression *this_00;
  pointer pPVar7;
  Transformer *this_01;
  pointer pCVar8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_02;
  type expr;
  long in_RDX;
  size_type *psVar9;
  Transformer *pTVar10;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var11;
  templated_unique_single_t case_node;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> test_raw
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> root_arg
  ;
  optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> w;
  CaseCheck case_check;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> local_110;
  undefined1 local_108 [48];
  Value local_d8;
  long local_90;
  undefined1 local_88 [88];
  
  this_00 = (CaseExpression *)operator_new(0x58);
  CaseExpression::CaseExpression(this_00);
  local_110._M_head_impl = this_00;
  local_108._40_8_ = this;
  TransformExpression((Transformer *)(local_108 + 0x10),
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  psVar9 = *(size_type **)(*(long *)(in_RDX + 0x18) + 8);
  local_90 = in_RDX;
  if (psVar9 != (size_type *)0x0) {
    do {
      local_d8.type_._0_8_ = (Transformer *)0x0;
      local_d8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108._32_8_ = *psVar9;
      optional_ptr<duckdb_libpgquery::PGCaseWhen,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> *)(local_108 + 0x20));
      TransformExpression((Transformer *)local_108,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pTVar10 = (Transformer *)local_d8.type_._0_8_;
      uVar4 = local_108._0_8_;
      if ((long *)local_108._16_8_ == (long *)0x0) {
        local_108._0_8_ = (Transformer *)0x0;
        uVar5 = local_108._0_8_;
        local_108[0] = (undefined1)uVar4;
        local_108[1] = SUB81(uVar4,1);
        local_108._2_6_ = SUB86(uVar4,2);
        local_d8.type_.id_ = local_108[0];
        local_d8.type_.physical_type_ = local_108[1];
        local_d8.type_._2_6_ = local_108._2_6_;
        local_108._0_8_ = uVar5;
        this_01 = (Transformer *)local_d8.type_._0_8_;
      }
      else {
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)(local_108 + 0x10));
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[0xc])(local_108 + 8,pPVar7);
        this_01 = (Transformer *)operator_new(0x48);
        local_88._0_8_ = local_108._8_8_;
        local_108._8_8_ = (Transformer *)0x0;
        local_108._24_8_ = local_108._0_8_;
        local_108._0_8_ = (Transformer *)0x0;
        ComparisonExpression::ComparisonExpression
                  ((ComparisonExpression *)this_01,COMPARE_BOUNDARY_START,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_88,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_108 + 0x18));
        if ((Transformer *)local_108._24_8_ != (Transformer *)0x0) {
          (*(((ParsedExpression *)local_108._24_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                    ();
        }
        local_108._24_8_ = (__buckets_ptr)0x0;
        if ((Transformer *)local_88._0_8_ != (Transformer *)0x0) {
          (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_88._0_8_)->ptr->options)();
        }
        pTVar10 = (Transformer *)local_108._8_8_;
        if ((Transformer *)local_d8.type_._0_8_ != (Transformer *)0x0) {
          poVar2 = (optional_ptr<duckdb::Transformer,_true> *)local_d8.type_._0_8_;
          local_d8.type_._0_8_ = this_01;
          (*(code *)poVar2->ptr->options)();
          pTVar10 = (Transformer *)local_108._8_8_;
          this_01 = (Transformer *)local_d8.type_._0_8_;
        }
      }
      local_d8.type_._0_8_ = this_01;
      if (pTVar10 != (Transformer *)0x0) {
        (*(code *)((pTVar10->parent).ptr)->options)();
      }
      optional_ptr<duckdb_libpgquery::PGCaseWhen,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGCaseWhen,_true> *)(local_108 + 0x20));
      TransformExpression((Transformer *)local_88,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      uVar4 = local_88._0_8_;
      peVar6 = local_d8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88._0_8_ = (Transformer *)0x0;
      local_d8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar4;
      if (peVar6 != (element_type *)0x0) {
        (**(code **)(*(long *)peVar6 + 8))();
      }
      if ((Transformer *)local_88._0_8_ != (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_88._0_8_)->ptr->options)();
      }
      pCVar8 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
               ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                             *)&local_110);
      ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
      emplace_back<duckdb::CaseCheck>
                (&(pCVar8->case_checks).
                  super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
                 (CaseCheck *)(local_108 + 0x30));
      if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_108._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if ((Transformer *)
          local_d8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)
                  &(local_d8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo)->ptr->options)();
      }
      local_d8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if ((Transformer *)local_d8.type_._0_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_d8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1]
        )();
      }
      psVar9 = (size_type *)psVar9[1];
    } while (psVar9 != (size_type *)0x0);
  }
  if (*(long *)(local_90 + 0x20) == 0) {
    LogicalType::LogicalType((LogicalType *)(local_88 + 0x40),SQLNULL);
    Value::Value((Value *)local_88,(LogicalType *)(local_88 + 0x40));
    this_02._M_head_impl = (ParsedExpression *)operator_new(0x78);
    _Var11._M_head_impl = (ParsedExpression *)local_108._40_8_;
    Value::Value((Value *)(local_108 + 0x30),(Value *)local_88);
    ConstantExpression::ConstantExpression
              ((ConstantExpression *)this_02._M_head_impl,(Value *)(local_108 + 0x30));
    Value::~Value((Value *)(local_108 + 0x30));
    pCVar8 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
             operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                         *)&local_110);
    _Var1._M_head_impl =
         (pCVar8->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar8->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = this_02._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value((Value *)local_88);
    LogicalType::~LogicalType((LogicalType *)(local_88 + 0x40));
  }
  else {
    TransformExpression((Transformer *)(local_108 + 0x30),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pCVar8 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
             operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                         *)&local_110);
    uVar4 = local_d8.type_._0_8_;
    _Var11._M_head_impl = (ParsedExpression *)local_108._40_8_;
    local_d8.type_._0_8_ = (Transformer *)0x0;
    _Var1._M_head_impl =
         (pCVar8->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar8->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar4;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((Transformer *)local_d8.type_._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_d8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
  }
  expr = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
         operator*((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                    *)&local_110);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(local_90 + 0x28));
  _Var3._M_head_impl = local_110._M_head_impl;
  local_110._M_head_impl = (CaseExpression *)0x0;
  ((_Var11._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)_Var3._M_head_impl;
  if ((long *)local_108._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_108._16_8_ + 8))();
  }
  if (local_110._M_head_impl != (CaseExpression *)0x0) {
    (*((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
      [1])();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         _Var11._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformCase(duckdb_libpgquery::PGCaseExpr &root) {
	auto case_node = make_uniq<CaseExpression>();
	auto root_arg = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	for (auto cell = root.args->head; cell != nullptr; cell = cell->next) {
		CaseCheck case_check;

		auto w = PGPointerCast<duckdb_libpgquery::PGCaseWhen>(cell->data.ptr_value);
		auto test_raw = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(w->expr));
		unique_ptr<ParsedExpression> test;
		if (root_arg) {
			case_check.when_expr =
			    make_uniq<ComparisonExpression>(ExpressionType::COMPARE_EQUAL, root_arg->Copy(), std::move(test_raw));
		} else {
			case_check.when_expr = std::move(test_raw);
		}
		case_check.then_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(w->result));
		case_node->case_checks.push_back(std::move(case_check));
	}

	if (root.defresult) {
		case_node->else_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.defresult));
	} else {
		case_node->else_expr = make_uniq<ConstantExpression>(Value(LogicalType::SQLNULL));
	}
	SetQueryLocation(*case_node, root.location);
	return std::move(case_node);
}